

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
__thiscall wabt::MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>(wabt *this,Location *args)

{
  ReturnCallIndirectExpr *this_00;
  Location *args_local;
  
  this_00 = (ReturnCallIndirectExpr *)operator_new(0xc0);
  ReturnCallIndirectExpr::ReturnCallIndirectExpr(this_00,args);
  std::unique_ptr<wabt::ReturnCallIndirectExpr,std::default_delete<wabt::ReturnCallIndirectExpr>>::
  unique_ptr<std::default_delete<wabt::ReturnCallIndirectExpr>,void>
            ((unique_ptr<wabt::ReturnCallIndirectExpr,std::default_delete<wabt::ReturnCallIndirectExpr>>
              *)this,this_00);
  return (__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}